

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_error.cc
# Opt level: O3

char * __thiscall ixxx::sys_error::what(sys_error *this)

{
  int __ecode;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ostringstream o;
  array<char,_256UL> buffer;
  long local_288 [14];
  ios_base local_218 [264];
  char local_110 [256];
  
  _Var5._M_head_impl =
       (this->what_)._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var5._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) goto LAB_001089eb;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_288 + (int)*(undefined8 *)(local_288[0] + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,": ",2);
  __ecode = this->errno_;
  if (__ecode != 0) {
    if (this->type_ == 1) {
      pcVar1 = gai_strerror(__ecode);
LAB_001088d5:
      if (pcVar1 == (char *)0x0) goto LAB_001088f5;
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,pcVar1,sVar2);
    }
    else {
      if (this->type_ == 0) {
        local_110[0] = '\0';
        pcVar1 = strerror_r(__ecode,local_110,0x100);
        goto LAB_001088d5;
      }
LAB_001088f5:
      std::ios::clear((int)local_288 + (int)*(undefined8 *)(local_288[0] + -0x18));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288," (",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_288,this->errno_);
    local_110[0] = ')';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_110,1);
  }
  pcVar1 = this->literal_;
  if (pcVar1 != (char *)0x0) {
    if (this->errno_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288," - ",3);
      pcVar1 = this->literal_;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)local_288 + (int)*(undefined8 *)(local_288[0] + -0x18));
        goto LAB_0010899e;
      }
    }
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,pcVar1,sVar2);
  }
LAB_0010899e:
  _Var4._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::stringbuf::str();
  this_00 = &this->what_;
  _Var5._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = _Var4._M_head_impl;
  if (_Var5._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00,_Var5._M_head_impl);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base(local_218);
  _Var5._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
LAB_001089eb:
  return ((_Var5._M_head_impl)->_M_dataplus)._M_p;
}

Assistant:

Function getsockopt_error::function() const { return Function::GETSOCKOPT; }